

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::Document::Document(Document *this,Parser *parser,ImportSettings *settings)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  
  this->settings = settings;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objects)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->parser = parser;
  p_Var1 = &(this->templates)._M_t._M_impl.super__Rb_tree_header;
  (this->templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->templates)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->templates)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->src_connections)._M_t._M_impl.super__Rb_tree_header;
  (this->src_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->src_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->src_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->src_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->src_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->dest_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dest_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->dest_connections)._M_t._M_impl.super__Rb_tree_header;
  (this->dest_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->dest_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->dest_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->creator)._M_dataplus._M_p = (pointer)&(this->creator).field_2;
  (this->creator)._M_string_length = 0;
  (this->creator).field_2._M_local_buf[0] = '\0';
  (this->animationStacksResolved).
  super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->animationStacksResolved).
  super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->animationStacks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->animationStacksResolved).
  super__Vector_base<const_Assimp::FBX::AnimationStack_*,_std::allocator<const_Assimp::FBX::AnimationStack_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->animationStacks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->animationStacks).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->globals)._M_t.
  super___uniq_ptr_impl<Assimp::FBX::FileGlobalSettings,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
  ._M_t.
  super__Tuple_impl<0UL,_Assimp::FBX::FileGlobalSettings_*,_std::default_delete<Assimp::FBX::FileGlobalSettings>_>
  .super__Head_base<0UL,_Assimp::FBX::FileGlobalSettings_*,_false>._M_head_impl =
       (FileGlobalSettings *)0x0;
  for (lVar2 = 0xf8; lVar2 != 0x114; lVar2 = lVar2 + 4) {
    *(undefined4 *)((long)&this->settings + lVar2) = 0;
  }
  ReadHeader(this);
  ReadPropertyTemplates(this);
  ReadGlobalSettings(this);
  ReadObjects(this);
  ReadConnections(this);
  return;
}

Assistant:

Document::Document(const Parser& parser, const ImportSettings& settings)
: settings(settings)
, parser(parser)
{
    // Cannot use array default initialization syntax because vc8 fails on it
    for (auto &timeStamp : creationTimeStamp) {
        timeStamp = 0;
    }

    ReadHeader();
    ReadPropertyTemplates();

    ReadGlobalSettings();

    // This order is important, connections need parsed objects to check
    // whether connections are ok or not. Objects may not be evaluated yet,
    // though, since this may require valid connections.
    ReadObjects();
    ReadConnections();
}